

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

int abon(void)

{
  schar sVar1;
  schar sVar2;
  int iVar3;
  uint uVar4;
  
  sVar1 = acurr(0);
  sVar2 = acurr(3);
  if (u.umonnum == u.umonster) {
    uVar4 = 0xfffffffe;
    if (((('\x05' < sVar1) && (uVar4 = 0xffffffff, '\a' < sVar1)) && (uVar4 = 0, '\x10' < sVar1)) &&
       (uVar4 = 1, 'D' < sVar1)) {
      uVar4 = sVar1 < 'v' ^ 3;
    }
    iVar3 = (u.ulevel < 3) + uVar4;
    if ('\x03' < sVar2) {
      if (sVar2 < '\x06') {
        return iVar3 + -2;
      }
      if (sVar2 < '\b') {
        return iVar3 + -1;
      }
      if (sVar2 < '\x0e') {
        return iVar3;
      }
      return iVar3 + (char)(sVar2 + -0xe);
    }
  }
  else {
    iVar3 = adj_lev(&u.uz,mons + u.umonnum);
  }
  return iVar3 + -3;
}

Assistant:

int abon(void)
{
	int sbon;
	int str = ACURR(A_STR), dex = ACURR(A_DEX);

	if (Upolyd) return adj_lev(&u.uz, &mons[u.umonnum]) - 3;
	if (str < 6) sbon = -2;
	else if (str < 8) sbon = -1;
	else if (str < 17) sbon = 0;
	else if (str <= STR18(50)) sbon = 1;	/* up to 18/50 */
	else if (str < STR18(100)) sbon = 2;
	else sbon = 3;

/* Game tuning kludge: make it a bit easier for a low level character to hit */
	sbon += (u.ulevel < 3) ? 1 : 0;

	if (dex < 4) return sbon-3;
	else if (dex < 6) return sbon-2;
	else if (dex < 8) return sbon-1;
	else if (dex < 14) return sbon;
	else return sbon + dex-14;
}